

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O0

t_object * __thiscall
xemmai::t_engine::f_allocate_for_type<xemmai::t_type_of<xemmai::t_child>>
          (t_engine *this,size_t a_fields)

{
  t_object *ptVar1;
  size_t sVar2;
  ulong a_size;
  long *plVar3;
  undefined8 *puVar4;
  size_t a_fields_local;
  t_engine *this_local;
  t_object *p;
  t_object *local_30;
  t_object *p_1;
  t_object *local_10;
  
  sVar2 = t_object::f_align_for_fields(0x178);
  a_size = sVar2 + a_fields * 0x28 + 0x48;
  if (a_size < 0x81) {
    plVar3 = (long *)__tls_get_addr(&PTR_00163d80);
    local_10 = (t_object *)*plVar3;
    if (local_10 == (t_object *)0x0) {
      local_10 = t_heap<xemmai::t_object>::f_allocate_from<0ul,65536ul>
                           ((t_heap<xemmai::t_object> *)(this + 0x30),
                            (t_of<0UL,_65536UL> *)(this + 0x90));
    }
    else {
      ptVar1 = local_10->v_next;
      puVar4 = (undefined8 *)__tls_get_addr(&PTR_00163d80);
      *puVar4 = ptVar1;
    }
    local_30 = local_10;
  }
  else {
    local_30 = t_heap<xemmai::t_object>::f_allocate_medium
                         ((t_heap<xemmai::t_object> *)(this + 0x30),a_size);
  }
  local_30->v_next = (t_object *)0x0;
  return local_30;
}

Assistant:

t_object* f_allocate_for_type(size_t a_fields)
	{
		return f_allocate(t_object::f_align_for_fields(sizeof(T)) + (sizeof(std::pair<t_slot, t_svalue>) + sizeof(std::pair<t_object*, size_t>)) * a_fields);
	}